

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O3

void __thiscall QLineEdit::mouseMoveEvent(QLineEdit *this,QMouseEvent *e)

{
  QLineEditPrivate *this_00;
  ulong uVar1;
  bool bVar2;
  LayoutDirection LVar3;
  QWidgetLineControl *this_01;
  int iVar4;
  int iVar6;
  double dVar5;
  int iVar7;
  int iVar9;
  double extraout_XMM1_Qa;
  double extraout_XMM1_Qa_00;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  
  this_00 = *(QLineEditPrivate **)&(this->super_QWidget).field_0x8;
  if (((byte)e[0x44] & 1) == 0) goto LAB_00419944;
  if ((this_00->dndTimer).m_id != Invalid) {
    auVar10 = QEventPoint::position();
    auVar8._0_8_ = (double)((ulong)auVar10._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                   auVar10._0_8_;
    auVar8._8_8_ = (double)((ulong)auVar10._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                   auVar10._8_8_;
    auVar10 = maxpd(auVar8,_DAT_006605e0);
    iVar7 = (this_00->mousePressPos).xp.m_i -
            (int)(double)(~-(ulong)(2147483647.0 < auVar8._0_8_) & auVar10._0_8_ |
                         -(ulong)(2147483647.0 < auVar8._0_8_) & 0x41dfffffffc00000);
    iVar9 = (this_00->mousePressPos).yp.m_i -
            (int)(double)(~-(ulong)(2147483647.0 < auVar8._8_8_) & auVar10._8_8_ |
                         -(ulong)(2147483647.0 < auVar8._8_8_) & 0x41dfffffffc00000);
    iVar4 = iVar7 >> 0x1f;
    iVar6 = iVar9 >> 0x1f;
    uVar1 = CONCAT44(iVar9,iVar7) ^ CONCAT44(iVar6,iVar4);
    iVar7 = QApplication::startDragDistance();
    if (iVar7 < ((int)(uVar1 >> 0x20) - iVar6) + ((int)uVar1 - iVar4)) {
      QLineEditPrivate::drag(this_00);
    }
    goto LAB_00419944;
  }
  if (this_00->mouseYThreshold < 1) {
LAB_0041983d:
    bVar2 = QWidgetLineControl::composeMode((QWidgetLineControl *)this_00->control);
    if (bVar2) {
      iVar7 = QLineEditPrivate::xToPos
                        (this_00,(this_00->mousePressPos).xp.m_i,CursorBetweenCharacters);
      dVar5 = (double)QEventPoint::position();
      dVar5 = (double)((ulong)dVar5 & 0x8000000000000000 | (ulong)DAT_006605c0) + dVar5;
      bVar2 = 2147483647.0 < dVar5;
      if (dVar5 <= -2147483648.0) {
        dVar5 = -2147483648.0;
      }
      iVar4 = QLineEditPrivate::xToPos
                        (this_00,(int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 |
                                              ~-(ulong)bVar2 & (ulong)dVar5),CursorBetweenCharacters
                        );
      if (iVar4 - iVar7 != 0) {
        QWidgetLineControl::setSelection((QWidgetLineControl *)this_00->control,iVar7,iVar4 - iVar7)
        ;
      }
      goto LAB_00419944;
    }
    this_01 = this_00->control;
    dVar5 = (double)QEventPoint::position();
    dVar5 = (double)((ulong)dVar5 & 0x8000000000000000 | (ulong)DAT_006605c0) + dVar5;
    bVar2 = 2147483647.0 < dVar5;
    if (dVar5 <= -2147483648.0) {
      dVar5 = -2147483648.0;
    }
    iVar7 = QLineEditPrivate::xToPos
                      (this_00,(int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 |
                                            ~-(ulong)bVar2 & (ulong)dVar5),CursorBetweenCharacters);
  }
  else {
    QEventPoint::position();
    dVar5 = (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | (ulong)DAT_006605c0) +
            extraout_XMM1_Qa;
    bVar2 = 2147483647.0 < dVar5;
    if (dVar5 <= -2147483648.0) {
      dVar5 = -2147483648.0;
    }
    if ((int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar5) <=
        (this_00->mousePressPos).yp.m_i + this_00->mouseYThreshold) {
      if (0 < this_00->mouseYThreshold) {
        QEventPoint::position();
        dVar5 = (double)((ulong)extraout_XMM1_Qa_00 & 0x8000000000000000 | (ulong)DAT_006605c0) +
                extraout_XMM1_Qa_00;
        bVar2 = 2147483647.0 < dVar5;
        if (dVar5 <= -2147483648.0) {
          dVar5 = -2147483648.0;
        }
        if ((int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar5) +
            this_00->mouseYThreshold < (this_00->mousePressPos).yp.m_i) {
          LVar3 = QWidget::layoutDirection(&this->super_QWidget);
          this_01 = this_00->control;
          if (LVar3 == RightToLeft) goto LAB_00419835;
          goto LAB_004197b8;
        }
      }
      goto LAB_0041983d;
    }
    LVar3 = QWidget::layoutDirection(&this->super_QWidget);
    this_01 = this_00->control;
    if (LVar3 == RightToLeft) {
LAB_004197b8:
      iVar7 = 0;
    }
    else {
LAB_00419835:
      iVar7 = (int)(this_01->m_text).d.size;
    }
  }
  QWidgetLineControl::moveCursor((QWidgetLineControl *)this_01,iVar7,true);
LAB_00419944:
  QLineEditPrivate::sendMouseEventToInputContext(this_00,e);
  return;
}

Assistant:

void QLineEdit::mouseMoveEvent(QMouseEvent * e)
{
    Q_D(QLineEdit);

    if (e->buttons() & Qt::LeftButton) {
#if QT_CONFIG(draganddrop)
        if (d->dndTimer.isActive()) {
            if ((d->mousePressPos - e->position().toPoint()).manhattanLength() > QApplication::startDragDistance())
                d->drag();
        } else
#endif
        {
#ifndef Q_OS_ANDROID
            const bool select = true;
#else
            const bool select = (d->imHints & Qt::ImhNoPredictiveText);
#endif
#ifndef QT_NO_IM
            if (d->mouseYThreshold > 0 && e->position().toPoint().y() > d->mousePressPos.y() + d->mouseYThreshold) {
                if (layoutDirection() == Qt::RightToLeft)
                    d->control->home(select);
                else
                    d->control->end(select);
            } else if (d->mouseYThreshold > 0 && e->position().toPoint().y() + d->mouseYThreshold < d->mousePressPos.y()) {
                if (layoutDirection() == Qt::RightToLeft)
                    d->control->end(select);
                else
                    d->control->home(select);
            } else if (d->control->composeMode() && select) {
                int startPos = d->xToPos(d->mousePressPos.x());
                int currentPos = d->xToPos(e->position().toPoint().x());
                if (startPos != currentPos)
                    d->control->setSelection(startPos, currentPos - startPos);

            } else
#endif
            {
                d->control->moveCursor(d->xToPos(e->position().toPoint().x()), select);
            }
        }
    }

    d->sendMouseEventToInputContext(e);
}